

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

int64_t libtorrent::aux::calc_bytes(file_storage *fs,piece_count *pc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = pc->num_pieces;
  iVar2 = fs->m_piece_length;
  if (pc->last_piece == true) {
    iVar3 = file_storage::piece_size(fs,(piece_index_t)(fs->m_num_pieces + -1));
    lVar4 = (long)iVar2 - (long)iVar3;
  }
  else {
    lVar4 = 0;
  }
  return (long)iVar2 * (long)iVar1 - (lVar4 + pc->pad_bytes);
}

Assistant:

std::int64_t calc_bytes(file_storage const& fs, piece_count const& pc)
	{
		// it's an impossible combination to have 0 pieces, but still have one of them be the last piece
		TORRENT_ASSERT(!(pc.num_pieces == 0 && pc.last_piece == true));

		// if we have 0 pieces, we can't have any pad blocks either
		TORRENT_ASSERT(!(pc.num_pieces == 0 && pc.pad_bytes > 0));

		// if we have all pieces, we must also have the last one
		TORRENT_ASSERT(!(pc.num_pieces == fs.num_pieces() && pc.last_piece == false));

		// every block should not be a pad block
		TORRENT_ASSERT(pc.pad_bytes <= std::int64_t(pc.num_pieces) * fs.piece_length());

		return std::int64_t(pc.num_pieces) * fs.piece_length()
			- (pc.last_piece ? fs.piece_length() - fs.piece_size(fs.last_piece()) : 0)
			- std::int64_t(pc.pad_bytes);
	}